

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.h
# Opt level: O0

void __thiscall
chrono::ChQuaternion<double>::ArchiveOUT(ChQuaternion<double> *this,ChArchiveOut *marchive)

{
  ChArchiveOut *pCVar1;
  ChNameValue<double> local_88;
  ChNameValue<double> local_70;
  ChNameValue<double> local_58;
  ChNameValue<double> local_30;
  ChArchiveOut *local_18;
  ChArchiveOut *marchive_local;
  ChQuaternion<double> *this_local;
  
  local_18 = marchive;
  marchive_local = (ChArchiveOut *)this;
  ChArchiveOut::VersionWrite<chrono::ChQuaternion<double>>(marchive);
  pCVar1 = local_18;
  make_ChNameValue<double>(&local_30,"m_data[0]",this->m_data,"e0",'\0');
  ChArchiveOut::operator<<(pCVar1,&local_30);
  ChNameValue<double>::~ChNameValue(&local_30);
  pCVar1 = local_18;
  make_ChNameValue<double>(&local_58,"m_data[1]",this->m_data + 1,"e1",'\0');
  ChArchiveOut::operator<<(pCVar1,&local_58);
  ChNameValue<double>::~ChNameValue(&local_58);
  pCVar1 = local_18;
  make_ChNameValue<double>(&local_70,"m_data[2]",this->m_data + 2,"e2",'\0');
  ChArchiveOut::operator<<(pCVar1,&local_70);
  ChNameValue<double>::~ChNameValue(&local_70);
  pCVar1 = local_18;
  make_ChNameValue<double>(&local_88,"m_data[3]",this->m_data + 3,"e3",'\0');
  ChArchiveOut::operator<<(pCVar1,&local_88);
  ChNameValue<double>::~ChNameValue(&local_88);
  return;
}

Assistant:

inline void ChQuaternion<Real>::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChQuaternion<double>>();  // must use specialized template (any)
    // stream out all member m_data
    marchive << CHNVP(m_data[0], "e0");
    marchive << CHNVP(m_data[1], "e1");
    marchive << CHNVP(m_data[2], "e2");
    marchive << CHNVP(m_data[3], "e3");
}